

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O1

int comp(void *elem1,void *elem2)

{
  int iVar1;
  
  iVar1 = 1;
  if (*(uint *)((long)elem1 + 0x80) <= *(uint *)((long)elem2 + 0x80)) {
    iVar1 = -(uint)(*(uint *)((long)elem1 + 0x80) < *(uint *)((long)elem2 + 0x80));
  }
  return iVar1;
}

Assistant:

int comp(const void *elem1, const void *elem2)
{
    unsigned long f = ((struct snif*)elem1)->current.can_id;
    unsigned long s = ((struct snif*)elem2)->current.can_id;

    if (f > s)
	    return  1;
    if (f < s)
	    return -1;

    return 0;
}